

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxIdentifier::Resolve(FxIdentifier *this,FCompileContext *ctx)

{
  BYTE BVar1;
  PStruct *pPVar2;
  bool bVar3;
  int iVar4;
  uint val;
  FxLocalVariableDeclaration *var;
  FxLocalVariable *this_00;
  FxSelf *pFVar5;
  DObject *this_01;
  undefined4 extraout_var;
  FxGlobalVariable *this_02;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_00;
  PField *mem;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FBaseCVar *cvar;
  char *pcVar6;
  char *pcVar7;
  FName *name;
  PClass *pPVar8;
  size_t sVar9;
  FCompileContext *this_03;
  FScriptPosition *pFVar10;
  FxExpression *local_50;
  PSymbolTable *symtbl;
  FName local_40;
  FName local_3c;
  FName local_38;
  FName local_34;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  iVar4 = (this->Identifier).Index;
  name = &local_34;
  local_34.Index = iVar4;
  var = FCompileContext::FindLocalVariable(ctx,name);
  if (var != (FxLocalVariableDeclaration *)0x0) {
    if ((var->super_FxExpression).ExprType == EFX_StaticArray) {
      this_00 = (FxLocalVariable *)FxExpression::operator_new((FxExpression *)0x38,(size_t)name);
      FxStaticArrayVariable::FxStaticArrayVariable
                ((FxStaticArrayVariable *)this_00,var,&(this->super_FxExpression).ScriptPosition);
    }
    else {
      BVar1 = ((var->super_FxExpression).ValueType)->RegType;
      this_00 = (FxLocalVariable *)FxExpression::operator_new((FxExpression *)0x38,(size_t)name);
      if (BVar1 == 0x80) {
        FxStackVariable::FxStackVariable
                  ((FxStackVariable *)this_00,(var->super_FxExpression).ValueType,var->StackOffset,
                   &(this->super_FxExpression).ScriptPosition);
      }
      else {
        FxLocalVariable::FxLocalVariable(this_00,var,&(this->super_FxExpression).ScriptPosition);
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    UNRECOVERED_JUMPTABLE = (this_00->super_FxExpression)._vptr_FxExpression[2];
LAB_005124a7:
    iVar4 = (*UNRECOVERED_JUMPTABLE)(this_00,ctx);
    return (FxExpression *)CONCAT44(extraout_var_00,iVar4);
  }
  if (iVar4 == 0x249) {
    pPVar2 = ((ctx->Function->Variants).Array)->SelfClass;
    if (pPVar2 == (PStruct *)0x0) {
      pcVar7 = "Unable to access class defaults from static function";
    }
    else {
      pPVar8 = PClassActor::RegistrationInfo.MyClass;
      bVar3 = DObject::IsKindOf((DObject *)pPVar2,PClassActor::RegistrationInfo.MyClass);
      if (bVar3) {
        this_00 = (FxLocalVariable *)FxExpression::operator_new((FxExpression *)0x38,(size_t)pPVar8)
        ;
        pFVar5 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pPVar8);
        pFVar10 = &(this->super_FxExpression).ScriptPosition;
        FxSelf::FxSelf(pFVar5,pFVar10,false);
        FxClassDefaults::FxClassDefaults((FxClassDefaults *)this_00,(FxExpression *)pFVar5,pFVar10);
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        UNRECOVERED_JUMPTABLE = (this_00->super_FxExpression)._vptr_FxExpression[2];
        goto LAB_005124a7;
      }
      pcVar7 = "\'Default\' requires an actor type.";
    }
LAB_00512573:
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar7);
LAB_00512680:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  }
  else {
    local_38.Index = iVar4;
    this_01 = (DObject *)FCompileContext::FindInSelfClass(ctx,&local_38,&symtbl);
    if ((this_01 == (DObject *)0x0) ||
       (pPVar8 = PField::RegistrationInfo.MyClass,
       bVar3 = DObject::IsKindOf(this_01,PField::RegistrationInfo.MyClass), !bVar3)) {
      local_3c.Index = (this->Identifier).Index;
      this_03 = ctx;
      mem = (PField *)FCompileContext::FindInClass(ctx,&local_3c,&symtbl);
      if (mem == (PField *)0x0) {
        if (this->noglobal == true) {
          (this->super_FxExpression).ValueType = &TypeError->super_PType;
          return &this->super_FxExpression;
        }
        local_40.Index = (this->Identifier).Index;
        mem = (PField *)FCompileContext::FindGlobal(this_03,&local_40);
        if (mem == (PField *)0x0) {
          val = P_FindLineSpecial(FName::NameData.NameArray[(this->Identifier).Index].Text,
                                  (int *)0x0,(int *)0x0);
          if (val == 0) {
            sVar9 = 0;
            cvar = FindCVar(FName::NameData.NameArray[(this->Identifier).Index].Text,
                            (FBaseCVar **)0x0);
            if (cvar == (FBaseCVar *)0x0) {
              pcVar7 = FName::NameData.NameArray[(this->Identifier).Index].Text;
              pcVar6 = "Unknown identifier \'%s\'";
              goto LAB_00512679;
            }
            if ((cvar->Flags & 2) != 0) {
              pcVar7 = "Cannot access userinfo CVARs directly. Use GetCVar() instead.";
              goto LAB_00512573;
            }
            this_02 = (FxGlobalVariable *)FxExpression::operator_new((FxExpression *)0x30,sVar9);
            FxCVar::FxCVar((FxCVar *)this_02,cvar,&(this->super_FxExpression).ScriptPosition);
          }
          else {
            pFVar10 = &(this->super_FxExpression).ScriptPosition;
            sVar9 = 8;
            FScriptPosition::Message
                      (pFVar10,8,"Resolving name \'%s\' as line special %d\n",
                       FName::NameData.NameArray[(this->Identifier).Index].Text,(ulong)val);
            this_02 = (FxGlobalVariable *)FxExpression::operator_new((FxExpression *)0x38,sVar9);
            FxConstant::FxConstant((FxConstant *)this_02,val,pFVar10);
          }
        }
        else {
          bVar3 = DObject::IsKindOf((DObject *)mem,PSymbolConst::RegistrationInfo.MyClass);
          if (bVar3) {
            pcVar7 = FName::NameData.NameArray[(this->Identifier).Index].Text;
            pcVar6 = "Resolving name \'%s\' as global constant\n";
            goto LAB_00512519;
          }
          bVar3 = DObject::IsKindOf((DObject *)mem,PField::RegistrationInfo.MyClass);
          pFVar10 = &(this->super_FxExpression).ScriptPosition;
          pcVar7 = FName::NameData.NameArray[(this->Identifier).Index].Text;
          if (!bVar3) {
            pcVar6 = "Invalid global identifier \'%s\'\n";
LAB_00512679:
            FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar6,pcVar7);
            goto LAB_00512680;
          }
          sVar9 = 8;
          FScriptPosition::Message(pFVar10,8,"Resolving name \'%s\' as global variable\n",pcVar7);
          this_02 = (FxGlobalVariable *)FxExpression::operator_new((FxExpression *)0x38,sVar9);
          FxGlobalVariable::FxGlobalVariable(this_02,mem,pFVar10);
        }
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)mem,PSymbolConst::RegistrationInfo.MyClass);
        if (!bVar3) {
          if ((((ctx->Function->Variants).Array)->SelfClass == ctx->Class) ||
             (pPVar8 = PField::RegistrationInfo.MyClass,
             bVar3 = DObject::IsKindOf((DObject *)mem,PField::RegistrationInfo.MyClass), !bVar3)) {
            bVar3 = DObject::IsKindOf((DObject *)mem,PFunction::RegistrationInfo.MyClass);
            pcVar7 = FName::NameData.NameArray[(this->Identifier).Index].Text;
            pcVar6 = "Invalid member identifier \'%s\'.\n";
            if (bVar3) {
              pcVar6 = "Function \'%s\' used without ().\n";
            }
            goto LAB_00512679;
          }
          pFVar5 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pPVar8);
          pFVar10 = &(this->super_FxExpression).ScriptPosition;
          FxSelf::FxSelf(pFVar5,pFVar10,true);
          iVar4 = (*(pFVar5->super_FxExpression)._vptr_FxExpression[2])(pFVar5,ctx);
          local_50 = (FxExpression *)CONCAT44(extraout_var_02,iVar4);
          this_02 = (FxGlobalVariable *)ResolveMember(this,ctx,ctx->Class,&local_50,ctx->Class);
          if (this_02 != (FxGlobalVariable *)0x0) {
            FScriptPosition::Message
                      (pFVar10,3,"Self pointer used in ambiguous context; VM execution may abort!");
            ctx->Unsafe = true;
            goto LAB_00512534;
          }
          goto LAB_00512680;
        }
        pcVar7 = FName::NameData.NameArray[(this->Identifier).Index].Text;
        pcVar6 = "Resolving name \'%s\' as class constant\n";
LAB_00512519:
        pFVar10 = &(this->super_FxExpression).ScriptPosition;
        FScriptPosition::Message(pFVar10,8,pcVar6,pcVar7);
        this_02 = (FxGlobalVariable *)FxConstant::MakeConstant(&mem->super_PSymbol,pFVar10);
      }
    }
    else {
      pFVar5 = (FxSelf *)FxExpression::operator_new((FxExpression *)0x30,(size_t)pPVar8);
      FxSelf::FxSelf(pFVar5,&(this->super_FxExpression).ScriptPosition,false);
      iVar4 = (*(pFVar5->super_FxExpression)._vptr_FxExpression[2])(pFVar5,ctx);
      local_50 = (FxExpression *)CONCAT44(extraout_var,iVar4);
      pPVar2 = ((ctx->Function->Variants).Array)->SelfClass;
      this_02 = (FxGlobalVariable *)ResolveMember(this,ctx,pPVar2,&local_50,pPVar2);
      if (this_02 == (FxGlobalVariable *)0x0) goto LAB_00512680;
    }
LAB_00512534:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    if (this_02 != (FxGlobalVariable *)0x0) {
      iVar4 = (*(this_02->super_FxExpression)._vptr_FxExpression[2])(this_02,ctx);
      return (FxExpression *)CONCAT44(extraout_var_01,iVar4);
    }
  }
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxIdentifier::Resolve(FCompileContext& ctx)
{
	PSymbol * sym;
	FxExpression *newex = nullptr;
	int num;
	
	CHECKRESOLVED();

	// Local variables have highest priority.
	FxLocalVariableDeclaration *local = ctx.FindLocalVariable(Identifier);
	if (local != nullptr)
	{
		if (local->ExprType == EFX_StaticArray)
		{
			auto x = new FxStaticArrayVariable(local, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
		else if (local->ValueType->GetRegType() != REGT_NIL)
		{
			auto x = new FxLocalVariable(local, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			auto x = new FxStackVariable(local->ValueType, local->StackOffset, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}

	if (Identifier == NAME_Default)
	{
		if (ctx.Function->Variants[0].SelfClass == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Unable to access class defaults from static function");
			delete this;
			return nullptr;
		}
		if (!ctx.Function->Variants[0].SelfClass->IsKindOf(RUNTIME_CLASS(PClassActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}

		FxExpression * x = new FxClassDefaults(new FxSelf(ScriptPosition), ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}

	// Ugh, the horror. Constants need to be taken from the owning class, but members from the self class to catch invalid accesses here...
	// see if the current class (if valid) defines something with this name.
	PSymbolTable *symtbl;

	// first check fields in self
	if ((sym = ctx.FindInSelfClass(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			FxExpression *self = new FxSelf(ScriptPosition);
			self = self->Resolve(ctx);
			newex = ResolveMember(ctx, ctx.Function->Variants[0].SelfClass, self, ctx.Function->Variants[0].SelfClass);
			ABORT(newex);
			goto foundit;
		}
	}

	// now check in the owning class.
	if (newex == nullptr && (sym = ctx.FindInClass(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as class constant\n", Identifier.GetChars());
			newex = FxConstant::MakeConstant(sym, ScriptPosition);
			goto foundit;
		}
		// Do this check for ZScript as well, so that a clearer error message can be printed. MSG_OPTERROR will default to MSG_ERROR there.
		else if (ctx.Function->Variants[0].SelfClass != ctx.Class && sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			FxExpression *self = new FxSelf(ScriptPosition, true);
			self = self->Resolve(ctx);
			newex = ResolveMember(ctx, ctx.Class, self, ctx.Class);
			ABORT(newex);
			ScriptPosition.Message(MSG_OPTERROR, "Self pointer used in ambiguous context; VM execution may abort!");
			ctx.Unsafe = true;
			goto foundit;
		}
		else
		{
			if (sym->IsKindOf(RUNTIME_CLASS(PFunction)))
			{
				ScriptPosition.Message(MSG_ERROR, "Function '%s' used without ().\n", Identifier.GetChars());
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Invalid member identifier '%s'.\n", Identifier.GetChars());
			}
			delete this;
			return nullptr;
		}
	}

	if (noglobal)
	{
		// This is needed to properly resolve class names on the left side of the member access operator
		ValueType = TypeError;
		return this;
	}

	// now check the global identifiers.
	if (newex == nullptr && (sym = ctx.FindGlobal(Identifier)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as global constant\n", Identifier.GetChars());
			newex = FxConstant::MakeConstant(sym, ScriptPosition);
			goto foundit;
		}
		else if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			// internally defined global variable
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as global variable\n", Identifier.GetChars());
			newex = new FxGlobalVariable(static_cast<PField *>(sym), ScriptPosition);
			goto foundit;
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Invalid global identifier '%s'\n", Identifier.GetChars());
			delete this;
			return nullptr;
		}
	}

	// and line specials
	if (newex == nullptr && (num = P_FindLineSpecial(Identifier, nullptr, nullptr)))
	{
		ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as line special %d\n", Identifier.GetChars(), num);
		newex = new FxConstant(num, ScriptPosition);
		goto foundit;
	}

	if (auto *cvar = FindCVar(Identifier.GetChars(), nullptr))
	{
		if (cvar->GetFlags() & CVAR_USERINFO)
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot access userinfo CVARs directly. Use GetCVar() instead.");
			delete this;
			return nullptr;
		}
		newex = new FxCVar(cvar, ScriptPosition);
		goto foundit;
	}
	
	ScriptPosition.Message(MSG_ERROR, "Unknown identifier '%s'", Identifier.GetChars());
	delete this;
	return nullptr;

foundit:
	delete this;
	return newex? newex->Resolve(ctx) : nullptr;
}